

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  char *pcVar1;
  undefined1 *puVar2;
  size_type sVar3;
  pointer pcVar4;
  size_t __n;
  string *psVar5;
  bool bVar6;
  int iVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  string local_name;
  string local_pname;
  undefined1 local_151;
  char *local_150;
  long local_148;
  char local_140 [8];
  undefined8 uStack_138;
  undefined1 *local_130;
  size_t local_128;
  undefined1 local_120 [16];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  long local_108;
  char local_100 [8];
  undefined8 uStack_f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  long local_e8;
  char local_e0 [8];
  undefined8 uStack_d8;
  char *local_d0;
  long local_c8;
  char local_c0 [8];
  undefined8 uStack_b8;
  char *local_b0;
  long local_a8;
  char local_a0 [8];
  undefined8 uStack_98;
  undefined1 *local_90;
  size_t local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  if (name->_M_string_length < 3) {
    if ((name->_M_string_length != 2) || (*(name->_M_dataplus)._M_p != '-')) goto LAB_001252c4;
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    if (*pcVar1 != '-') {
LAB_001252c4:
      sVar3 = (this->pname_)._M_string_length;
      if (sVar3 != 0) {
        pcVar4 = (this->pname_)._M_dataplus._M_p;
        local_90 = local_80;
        ::std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar4,pcVar4 + sVar3);
        local_130 = local_120;
        pcVar4 = (name->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,pcVar4,pcVar4 + name->_M_string_length);
        if ((this->super_OptionBase<CLI::Option>).ignore_underscore_ == true) {
          local_f0._M_current = local_e0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,local_90,local_90 + local_88);
          local_151 = 0x5f;
          _Var8 = ::std::
                  __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (local_f0,local_f0._M_current + local_e8,
                             (_Iter_equals_val<const_char>)&local_151);
          local_148 = (long)_Var8._M_current - (long)local_f0._M_current;
          *_Var8._M_current = '\0';
          if (local_f0._M_current == local_e0) {
            uStack_138 = uStack_d8;
            local_150 = local_140;
          }
          else {
            local_150 = local_f0._M_current;
          }
          local_e8 = 0;
          local_e0[0] = '\0';
          local_f0._M_current = local_e0;
          ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_150);
          if (local_150 != local_140) {
            operator_delete(local_150);
          }
          if (local_f0._M_current != local_e0) {
            operator_delete(local_f0._M_current);
          }
          local_110._M_current = local_100;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,local_130,local_130 + local_128);
          local_151 = 0x5f;
          _Var8 = ::std::
                  __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (local_110,local_110._M_current + local_108,
                             (_Iter_equals_val<const_char>)&local_151);
          local_148 = (long)_Var8._M_current - (long)local_110._M_current;
          *_Var8._M_current = '\0';
          if (local_110._M_current == local_100) {
            uStack_138 = uStack_f8;
            local_150 = local_140;
          }
          else {
            local_150 = local_110._M_current;
          }
          local_108 = 0;
          local_100[0] = '\0';
          local_110._M_current = local_100;
          ::std::__cxx11::string::operator=((string *)&local_130,(string *)&local_150);
          if (local_150 != local_140) {
            operator_delete(local_150);
          }
          if (local_110._M_current != local_100) {
            operator_delete(local_110._M_current);
          }
        }
        if ((this->super_OptionBase<CLI::Option>).ignore_case_ == true) {
          local_b0 = local_a0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_90,local_90 + local_88);
          ::std::
          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                    (local_b0,local_b0 + local_a8,local_b0);
          if (local_b0 == local_a0) {
            uStack_138 = uStack_98;
            local_150 = local_140;
          }
          else {
            local_150 = local_b0;
          }
          local_148 = local_a8;
          local_a8 = 0;
          local_a0[0] = '\0';
          local_b0 = local_a0;
          ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_150);
          if (local_150 != local_140) {
            operator_delete(local_150);
          }
          if (local_b0 != local_a0) {
            operator_delete(local_b0);
          }
          local_d0 = local_c0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_130,local_130 + local_128);
          ::std::
          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                    (local_d0,local_d0 + local_c8,local_d0);
          if (local_d0 == local_c0) {
            uStack_138 = uStack_b8;
            local_150 = local_140;
          }
          else {
            local_150 = local_d0;
          }
          local_148 = local_c8;
          local_c8 = 0;
          local_c0[0] = '\0';
          local_d0 = local_c0;
          ::std::__cxx11::string::operator=((string *)&local_130,(string *)&local_150);
          if (local_150 != local_140) {
            operator_delete(local_150);
          }
          if (local_d0 != local_c0) {
            operator_delete(local_d0);
          }
        }
        puVar2 = local_130;
        if (local_128 == local_88) {
          if (local_128 == 0) {
            bVar6 = false;
          }
          else {
            iVar7 = bcmp(local_130,local_90,local_128);
            bVar6 = iVar7 != 0;
          }
        }
        else {
          bVar6 = true;
        }
        if (puVar2 != local_120) {
          operator_delete(puVar2);
        }
        if (local_90 != local_80) {
          operator_delete(local_90);
        }
        if (!bVar6) {
          return true;
        }
      }
      __n = (this->envname_)._M_string_length;
      if (__n == 0) {
        return false;
      }
      if (name->_M_string_length != __n) {
        return false;
      }
      iVar7 = bcmp((name->_M_dataplus)._M_p,(this->envname_)._M_dataplus._M_p,__n);
      return iVar7 == 0;
    }
    if (pcVar1[1] == '-') {
      ::std::__cxx11::string::substr((ulong)&local_50,(ulong)name);
      bVar6 = check_lname(this,&local_50);
      psVar5 = &local_50;
      goto LAB_001252ad;
    }
  }
  ::std::__cxx11::string::substr((ulong)&local_70,(ulong)name);
  bVar6 = check_sname(this,&local_70);
  psVar5 = &local_70;
LAB_001252ad:
  puVar2 = *(undefined1 **)((psVar5->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 != &psVar5->field_2) {
    operator_delete(puVar2);
  }
  return bVar6;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool Option::check_name(const std::string &name) const {

    if(name.length() > 2 && name[0] == '-' && name[1] == '-')
        return check_lname(name.substr(2));
    if(name.length() > 1 && name.front() == '-')
        return check_sname(name.substr(1));
    if(!pname_.empty()) {
        std::string local_pname = pname_;
        std::string local_name = name;
        if(ignore_underscore_) {
            local_pname = detail::remove_underscore(local_pname);
            local_name = detail::remove_underscore(local_name);
        }
        if(ignore_case_) {
            local_pname = detail::to_lower(local_pname);
            local_name = detail::to_lower(local_name);
        }
        if(local_name == local_pname) {
            return true;
        }
    }

    if(!envname_.empty()) {
        // this needs to be the original since envname_ shouldn't match on case insensitivity
        return (name == envname_);
    }
    return false;
}